

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O0

string * cmQtAutoGen::GeneratorNameUpper_abi_cxx11_(GenT genType)

{
  int iVar1;
  allocator<char> local_27;
  allocator<char> local_26;
  allocator<char> local_25 [16];
  allocator<char> local_15;
  GenT local_14;
  string *psStack_10;
  GenT genType_local;
  
  local_14 = genType;
  if ((GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOGEN_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::
                                   AUTOGEN_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOGEN_abi_cxx11_,
               "AUTOGEN",&local_15);
    std::allocator<char>::~allocator(&local_15);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOGEN_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOGEN_abi_cxx11_);
  }
  if ((GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOMOC_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::
                                   AUTOMOC_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOMOC_abi_cxx11_,
               "AUTOMOC",local_25);
    std::allocator<char>::~allocator(local_25);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOMOC_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOMOC_abi_cxx11_);
  }
  if ((GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOUIC_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::
                                   AUTOUIC_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOUIC_abi_cxx11_,
               "AUTOUIC",&local_26);
    std::allocator<char>::~allocator(&local_26);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOUIC_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOUIC_abi_cxx11_);
  }
  if ((GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTORCC_abi_cxx11_ == '\0') &&
     (iVar1 = __cxa_guard_acquire(&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::
                                   AUTORCC_abi_cxx11_), iVar1 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTORCC_abi_cxx11_,
               "AUTORCC",&local_27);
    std::allocator<char>::~allocator(&local_27);
    __cxa_atexit(std::__cxx11::string::~string,
                 &GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTORCC_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTORCC_abi_cxx11_);
  }
  switch(local_14) {
  case GEN:
    psStack_10 = &GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOGEN_abi_cxx11_;
    break;
  case MOC:
    psStack_10 = &GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOMOC_abi_cxx11_;
    break;
  case UIC:
    psStack_10 = &GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOUIC_abi_cxx11_;
    break;
  case RCC:
    psStack_10 = &GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTORCC_abi_cxx11_;
    break;
  default:
    psStack_10 = &GeneratorNameUpper[abi:cxx11](cmQtAutoGen::GenT)::AUTOGEN_abi_cxx11_;
  }
  return psStack_10;
}

Assistant:

std::string const& cmQtAutoGen::GeneratorNameUpper(GenT genType)
{
  static const std::string AUTOGEN("AUTOGEN");
  static const std::string AUTOMOC("AUTOMOC");
  static const std::string AUTOUIC("AUTOUIC");
  static const std::string AUTORCC("AUTORCC");

  switch (genType) {
    case GenT::GEN:
      return AUTOGEN;
    case GenT::MOC:
      return AUTOMOC;
    case GenT::UIC:
      return AUTOUIC;
    case GenT::RCC:
      return AUTORCC;
  }
  return AUTOGEN;
}